

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts
          (DeepScanLineInputFile *this,char *rawPixelData,DeepFrameBuffer *frameBuffer,int scanLine1
          ,int scanLine2)

{
  int iVar1;
  int iVar2;
  char *base_00;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  ostream *poVar8;
  ArgExc *pAVar9;
  Slice *pSVar10;
  uint in_ECX;
  DeepFrameBuffer *in_RDX;
  uint *in_RSI;
  long in_RDI;
  int in_R8D;
  int count;
  int accumulatedCount;
  int x;
  int lastAccumulatedCount;
  int y;
  int yStride;
  int xStride;
  char *base;
  char *readPtr;
  Compressor *decomp;
  uint64_t rawSampleCountTableSize;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  int maxY;
  uint64_t sampleCountTableDataSize;
  int data_scanline;
  int *in_stack_fffffffffffffbe8;
  char **in_stack_fffffffffffffbf0;
  Header *in_stack_fffffffffffffc48;
  size_t in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  Compression c;
  int local_394;
  int local_390;
  int local_38c;
  int local_388;
  uint local_384;
  uint *local_370;
  Compressor *local_368;
  ulong local_360;
  stringstream local_358 [16];
  ostream local_348 [392];
  stringstream local_1c0 [16];
  ostream local_1b0 [376];
  int local_38;
  int local_34;
  ulong local_30;
  uint local_24;
  int local_20;
  uint local_1c;
  DeepFrameBuffer *local_18;
  uint *local_10;
  
  c = (Compression)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  local_24 = *in_RSI;
  local_30 = *(ulong *)(in_RSI + 1);
  local_38 = local_24 + *(int *)(*(long *)(in_RDI + 8) + 0x168) + -1;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  piVar7 = std::min<int>(&local_38,(int *)(*(long *)(in_RDI + 8) + 0xe0));
  local_34 = *piVar7;
  if (local_1c != local_24) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1c0);
    poVar8 = std::operator<<(local_1b0,"readPixelSampleCounts(rawPixelData,frameBuffer,");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_1c);
    poVar8 = std::operator<<(poVar8,',');
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_20);
    poVar8 = std::operator<<(poVar8,") called with incorrect start scanline - should be ");
    std::ostream::operator<<(poVar8,local_24);
    pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar9,local_1c0);
    __cxa_throw(pAVar9,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  if (local_20 == local_34) {
    iVar5 = local_34 - local_24;
    iVar1 = *(int *)(*(long *)(in_RDI + 8) + 0xd8);
    iVar2 = *(int *)(*(long *)(in_RDI + 8) + 0xd4);
    iVar6 = Xdr::size<unsigned_int>();
    local_360 = (ulong)((iVar5 + 1) * ((iVar1 - iVar2) + 1) * iVar6);
    local_368 = (Compressor *)0x0;
    if (local_30 < local_360) {
      Header::compression((Header *)0x19ab0e);
      local_368 = newCompressor(c,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      (*local_368->_vptr_Compressor[6])
                (local_368,local_10 + 7,local_30 & 0xffffffff,(ulong)local_24,&local_370);
    }
    else {
      local_370 = local_10 + 7;
    }
    pSVar10 = DeepFrameBuffer::getSampleCountSlice(local_18);
    base_00 = pSVar10->base;
    pSVar10 = DeepFrameBuffer::getSampleCountSlice(local_18);
    sVar3 = pSVar10->xStride;
    pSVar10 = DeepFrameBuffer::getSampleCountSlice(local_18);
    sVar4 = pSVar10->yStride;
    for (local_384 = local_1c; (int)local_384 <= local_20; local_384 = local_384 + 1) {
      local_388 = 0;
      for (local_38c = *(int *)(*(long *)(in_RDI + 8) + 0xd4);
          local_38c <= *(int *)(*(long *)(in_RDI + 8) + 0xd8); local_38c = local_38c + 1) {
        Xdr::read<Imf_3_2::CharPtrIO,char_const*>
                  (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
        if (local_38c == *(int *)(*(long *)(in_RDI + 8) + 0xd4)) {
          local_394 = local_390;
        }
        else {
          local_394 = local_390 - local_388;
        }
        local_388 = local_390;
        piVar7 = sampleCount(base_00,(int)sVar3,(int)sVar4,local_38c,local_384);
        *piVar7 = local_394;
      }
    }
    if ((local_368 != (Compressor *)0x0) && (local_368 != (Compressor *)0x0)) {
      (*local_368->_vptr_Compressor[1])();
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_358);
  poVar8 = std::operator<<(local_348,"readPixelSampleCounts(rawPixelData,frameBuffer,");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_1c);
  poVar8 = std::operator<<(poVar8,',');
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_20);
  poVar8 = std::operator<<(poVar8,") called with incorrect end scanline - should be ");
  std::ostream::operator<<(poVar8,local_34);
  pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar9,local_358);
  __cxa_throw(pAVar9,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineInputFile::readPixelSampleCounts (
    const char*            rawPixelData,
    const DeepFrameBuffer& frameBuffer,
    int                    scanLine1,
    int                    scanLine2) const
{
    //
    // read header from block - already converted from Xdr to native format
    //
    int      data_scanline            = *(int*) rawPixelData;
    uint64_t sampleCountTableDataSize = *(uint64_t*) (rawPixelData + 4);

    int maxY;
    maxY = min (data_scanline + _data->linesInBuffer - 1, _data->maxY);

    if (scanLine1 != data_scanline)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "readPixelSampleCounts(rawPixelData,frameBuffer,"
                << scanLine1 << ',' << scanLine2
                << ") called with incorrect start scanline - should be "
                << data_scanline);
    }

    if (scanLine2 != maxY)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "readPixelSampleCounts(rawPixelData,frameBuffer,"
                << scanLine1 << ',' << scanLine2
                << ") called with incorrect end scanline - should be " << maxY);
    }

    //
    // If the sample count table is compressed, we'll uncompress it.
    //

    uint64_t rawSampleCountTableSize = (maxY - data_scanline + 1) *
                                       (_data->maxX - _data->minX + 1) *
                                       Xdr::size<unsigned int> ();

    Compressor* decomp = NULL;
    const char* readPtr;
    if (sampleCountTableDataSize < rawSampleCountTableSize)
    {
        decomp = newCompressor (
            _data->header.compression (),
            rawSampleCountTableSize,
            _data->header);

        decomp->uncompress (
            rawPixelData + 28,
            static_cast<int> (sampleCountTableDataSize),
            data_scanline,
            readPtr);
    }
    else
        readPtr = rawPixelData + 28;

    char* base  = frameBuffer.getSampleCountSlice ().base;
    int xStride = static_cast<int> (frameBuffer.getSampleCountSlice ().xStride);
    int yStride = static_cast<int> (frameBuffer.getSampleCountSlice ().yStride);

    for (int y = scanLine1; y <= scanLine2; y++)
    {
        int lastAccumulatedCount = 0;
        for (int x = _data->minX; x <= _data->maxX; x++)
        {
            int accumulatedCount, count;

            //
            // Read the sample count for pixel (x, y).
            //

            Xdr::read<CharPtrIO> (readPtr, accumulatedCount);
            if (x == _data->minX)
                count = accumulatedCount;
            else
                count = accumulatedCount - lastAccumulatedCount;
            lastAccumulatedCount = accumulatedCount;

            //
            // Store the data in both internal and external data structure.
            //

            sampleCount (base, xStride, yStride, x, y) = count;
        }
    }

    if (decomp) { delete decomp; }
}